

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entries.hpp
# Opt level: O3

size_t binlog::
       serializeSizePrefixedTagged<binlog::ClockSync,binlog::detail::RecoverableVectorOutputStream>
                 (ClockSync *entry,RecoverableVectorOutputStream *out)

{
  long lVar1;
  size_t in_RCX;
  size_t (*__range2) [6];
  uint uVar2;
  long lVar3;
  long lVar4;
  size_t field_sizes [6];
  ulong local_58 [7];
  
  local_58[0] = 0;
  local_58[1] = 8;
  local_58[2] = 8;
  local_58[3] = 8;
  local_58[4] = 4;
  local_58[5] = (entry->tzName)._M_string_length + 4;
  lVar3 = 0;
  lVar4 = 0;
  lVar1 = 0;
  do {
    lVar3 = lVar3 + local_58[lVar1];
    lVar4 = lVar4 + local_58[lVar1 + 1];
    lVar1 = lVar1 + 2;
  } while (lVar1 != 6);
  uVar2 = (int)lVar4 + (int)lVar3 + 8;
  local_58[0] = (ulong)uVar2;
  detail::RecoverableVectorOutputStream::write(out,(int)local_58,(void *)0x4,in_RCX);
  local_58[0] = 0xfffffffffffffffd;
  detail::RecoverableVectorOutputStream::write(out,(int)local_58,(void *)0x8,in_RCX);
  mserialize::
  StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(entry,out);
  return (ulong)uVar2 + 4;
}

Assistant:

std::size_t serializeSizePrefixedTagged(const Entry& entry, OutputStream& out)
{
  const std::uint64_t tag = Entry::Tag;
  const std::uint32_t size = std::uint32_t(mserialize::serialized_size(entry) + sizeof(tag));
  mserialize::serialize(size, out);
  mserialize::serialize(tag, out);
  mserialize::serialize(entry, out);

  return size + sizeof(size);
}